

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_dispatch.c
# Opt level: O0

void setptmode(global_State *g,GCproto *pt,int mode)

{
  uint in_EDX;
  global_State *in_RSI;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((in_EDX & 0x100) == 0) {
    if ((in_EDX & 0x200) == 0) {
      *(byte *)((long)(in_RSI->strbloom).next + 5) =
           *(byte *)((long)(in_RSI->strbloom).next + 5) | 8;
    }
    lj_trace_flushproto(in_RSI,(GCproto *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  }
  else {
    *(byte *)((long)(in_RSI->strbloom).next + 5) =
         *(byte *)((long)(in_RSI->strbloom).next + 5) & 0xf7;
    lj_trace_reenableproto((GCproto *)in_RSI);
  }
  return;
}

Assistant:

static void setptmode(global_State *g, GCproto *pt, int mode)
{
  if ((mode & LUAJIT_MODE_ON)) {  /* (Re-)enable JIT compilation. */
    pt->flags &= ~PROTO_NOJIT;
    lj_trace_reenableproto(pt);  /* Unpatch all ILOOP etc. bytecodes. */
  } else {  /* Flush and/or disable JIT compilation. */
    if (!(mode & LUAJIT_MODE_FLUSH))
      pt->flags |= PROTO_NOJIT;
    lj_trace_flushproto(g, pt);  /* Flush all traces of prototype. */
  }
}